

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deflate.cpp
# Opt level: O3

void __thiscall IZDeflate::lm_free(IZDeflate *this)

{
  return;
}

Assistant:

void IZDeflate::lm_free()
{
#    ifdef DYN_ALLOC
    if (window != NULL) {
        zcfree(window);
        window = NULL;
    }
    if (prev != NULL) {
        zcfree(prev);
        zcfree(head);
        prev = head = NULL;
    }
#    endif /* DYN_ALLOC */
}